

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_table_info.cpp
# Opt level: O1

unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> __thiscall
duckdb::CreateTableInfo::Copy(CreateTableInfo *this)

{
  pointer puVar1;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *puVar2;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var3;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var4;
  type other;
  pointer pCVar5;
  pointer pCVar6;
  pointer pSVar7;
  CreateInfo *in_RSI;
  unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *this_00;
  templated_unique_single_t result;
  _Head_base<0UL,_duckdb::CreateTableInfo_*,_false> local_d0;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_c8;
  __uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_> local_c0;
  undefined1 local_b8 [80];
  pointer local_68;
  pointer puStack_60;
  pointer local_58;
  bool local_50;
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> local_48;
  
  local_c0._M_t.
  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
  super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl =
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
       (tuple<duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)this;
  make_uniq<duckdb::CreateTableInfo,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((duckdb *)&local_d0,&in_RSI->catalog,&in_RSI->schema,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RSI + 1));
  other = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
          operator*((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                     *)&local_d0);
  CreateInfo::CopyProperties(in_RSI,&other->super_CreateInfo);
  ColumnList::Copy((ColumnList *)local_b8,(ColumnList *)&in_RSI[1].catalog.field_2);
  pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>::
           operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                       *)&local_d0);
  local_48.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (pCVar5->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_48.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (pCVar5->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (pCVar5->columns).columns.
       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (pCVar5->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_b8._0_8_;
  (pCVar5->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_b8._8_8_;
  (pCVar5->columns).columns.
  super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_b8._16_8_;
  local_b8._0_8_ =
       (__uniq_ptr_data<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true,_true>)0x0
  ;
  local_b8._8_8_ = (pointer)0x0;
  local_b8._16_8_ = (pointer)0x0;
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            (&local_48);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_M_move_assign((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&(pCVar5->columns).name_map,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)(local_b8 + 0x18));
  puVar1 = (pCVar5->columns).physical_columns.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  (pCVar5->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = local_68;
  (pCVar5->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = puStack_60;
  (pCVar5->columns).physical_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = local_58;
  local_68 = (pointer)0x0;
  puStack_60 = (pointer)0x0;
  local_58 = (pointer)0x0;
  if (puVar1 != (pointer)0x0) {
    operator_delete(puVar1);
  }
  (pCVar5->columns).allow_duplicate_names = local_50;
  if (local_68 != (pointer)0x0) {
    operator_delete(local_68);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)(local_b8 + 0x18));
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            ((vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> *)local_b8
            );
  this_00 = (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
            in_RSI[1].dependencies.set._M_h._M_element_count;
  puVar2 = *(unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> **)
            &in_RSI[1].dependencies.set._M_h._M_rehash_policy;
  if (this_00 != puVar2) {
    do {
      pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
               ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                             *)&local_d0);
      pCVar6 = unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true>::
               operator->(this_00);
      (*pCVar6->_vptr_Constraint[3])
                ((unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_b8,pCVar6);
      ::std::
      vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>,std::allocator<duckdb::unique_ptr<duckdb::Constraint,std::default_delete<duckdb::Constraint>,true>>>
                  *)&pCVar5->constraints,
                 (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> *)
                 local_b8);
      if ((pointer)local_b8._0_8_ != (pointer)0x0) {
        (**(code **)((((string *)local_b8._0_8_)->_M_dataplus)._M_p + 8))();
      }
      this_00 = this_00 + 1;
    } while (this_00 != puVar2);
  }
  if (in_RSI[1].dependencies.set._M_h._M_single_bucket != (__node_base_ptr)0x0) {
    pSVar7 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
             ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                           *)&in_RSI[1].dependencies.set._M_h._M_single_bucket);
    (*(pSVar7->super_SQLStatement)._vptr_SQLStatement[3])(&local_c8,pSVar7);
    _Var4._M_head_impl = local_c8._M_head_impl;
    local_c8._M_head_impl = (SelectStatement *)0x0;
    pCVar5 = unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
             ::operator->((unique_ptr<duckdb::CreateTableInfo,_std::default_delete<duckdb::CreateTableInfo>,_true>
                           *)&local_d0);
    _Var3._M_head_impl =
         (pCVar5->query).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pCVar5->query).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var3._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var3._M_head_impl)->super_SQLStatement + 8))();
    }
    if (local_c8._M_head_impl != (SelectStatement *)0x0) {
      (*((local_c8._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
    }
  }
  *(CreateTableInfo **)
   local_c0._M_t.
   super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
   super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = local_d0._M_head_impl;
  return (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)
         (_Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>)
         local_c0._M_t.
         super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
         super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<CreateInfo> CreateTableInfo::Copy() const {
	auto result = make_uniq<CreateTableInfo>(catalog, schema, table);
	CopyProperties(*result);
	result->columns = columns.Copy();
	for (auto &constraint : constraints) {
		result->constraints.push_back(constraint->Copy());
	}
	if (query) {
		result->query = unique_ptr_cast<SQLStatement, SelectStatement>(query->Copy());
	}
	return std::move(result);
}